

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix2.c
# Opt level: O0

char * test_matrix2_invert(void)

{
  short sVar1;
  byte local_31;
  float fStack_30;
  uint8_t i;
  matrix2 expected;
  matrix2 m;
  
  expected.field_0._8_4_ = 2.0;
  expected.field_0._12_4_ = 0.0;
  _fStack_30 = 0x3f000000;
  expected.field_0._0_4_ = 0.1;
  expected.field_0._4_4_ = 0.2;
  matrix2_invert((matrix2 *)((long)&expected.field_0 + 8));
  local_31 = 0;
  while( true ) {
    if (3 < local_31) {
      return (char *)0x0;
    }
    sVar1 = scalar_equalsf(*(float *)((long)&expected.field_0 + (ulong)local_31 * 4 + 8),
                           (&fStack_30)[local_31]);
    if (sVar1 == 0) break;
    local_31 = local_31 + 1;
  }
  return 
  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(145) : (assertion failed) ((scalar_equalsf(m.m[i], expected.m[i])))"
  ;
}

Assistant:

static char *test_matrix2_invert(void)
{
	struct matrix2 m = {2, 0, -1, 5};
	struct matrix2 expected = {(HYP_FLOAT)0.5, (HYP_FLOAT)0.0, (HYP_FLOAT)0.1, (HYP_FLOAT)0.2};
	uint8_t i;

	matrix2_invert(&m);
	for (i = 0; i < 4; i++) {
		test_assert(scalar_equals(m.m[i], expected.m[i]));
	}

	return NULL;
}